

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * Qt::reset(QTextStream *stream)

{
  QTextStreamPrivate *pQVar1;
  
  pQVar1 = (stream->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  (pQVar1->params).realNumberPrecision = 6;
  (pQVar1->params).integerBase = 0;
  (pQVar1->params).fieldWidth = 0;
  (pQVar1->params).padChar.ucs = L' ';
  (pQVar1->params).fieldAlignment = AlignRight;
  (pQVar1->params).realNumberNotation = SmartNotation;
  (pQVar1->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
  super_QFlagsStorage<QTextStream::NumberFlag> = (QFlagsStorage<QTextStream::NumberFlag>)0x0;
  return stream;
}

Assistant:

QTextStream &reset(QTextStream &stream)
{
    stream.reset();
    return stream;
}